

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BG_FactorGraphCreator.cpp
# Opt level: O0

void __thiscall
BG_FactorGraphCreator::Construct_AgentBGPolicy_Variables(BG_FactorGraphCreator *this)

{
  int iVar1;
  Index IVar2;
  type pBVar3;
  value_type *__x;
  undefined4 extraout_var;
  BayesianGameBase *this_00;
  LIndex i;
  shared_ptr<const_BayesianGameCollaborativeGraphical> *in_RDI;
  Var v;
  Index agI;
  Index in_stack_ffffffffffffffbc;
  size_type in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar4;
  
  pBVar3 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
  (*(pBVar3->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
    super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
    _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8
            );
  uVar4 = 0;
  while( true ) {
    __x = (value_type *)(ulong)uVar4;
    pBVar3 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
    iVar1 = (*(pBVar3->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])();
    if ((value_type *)CONCAT44(extraout_var,iVar1) <= __x) break;
    this_00 = (BayesianGameBase *)(ulong)uVar4;
    boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
    i = BayesianGameBase::GetNrPolicies(this_00,in_stack_ffffffffffffffbc);
    IVar2 = Globals::CastLIndexToIndex(i);
    libDAI::Var::Var((Var *)&stack0xffffffffffffffe0,(long)this_00,(ulong)IVar2);
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::push_back
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_RDI,__x);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void BG_FactorGraphCreator::Construct_AgentBGPolicy_Variables()
{   
    _m_vars.reserve( _m_bg->GetNrAgents() );

    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
    {
        libDAI::Var v(agI, CastLIndexToIndex(_m_bg->GetNrPolicies(agI)));
        _m_vars.push_back(v);
    }
}